

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopStart(Mem_Flex_t *pMan,int nCubes,int nVars)

{
  int iVar1;
  char *__s;
  int local_2c;
  int Length;
  int i;
  char *pCube;
  char *pSopCover;
  int nVars_local;
  int nCubes_local;
  Mem_Flex_t *pMan_local;
  
  iVar1 = nCubes * (nVars + 3);
  __s = Mem_FlexEntryFetch(pMan,iVar1 + 1);
  memset(__s,0x2d,(long)iVar1);
  __s[iVar1] = '\0';
  for (local_2c = 0; local_2c < nCubes; local_2c = local_2c + 1) {
    iVar1 = local_2c * (nVars + 3);
    __s[(long)nVars + (long)iVar1] = ' ';
    __s[(long)(nVars + 1) + (long)iVar1] = '1';
    __s[(long)(nVars + 2) + (long)iVar1] = '\n';
  }
  return __s;
}

Assistant:

char * Abc_SopStart( Mem_Flex_t * pMan, int nCubes, int nVars )
{
    char * pSopCover, * pCube;
    int i, Length;

    Length = nCubes * (nVars + 3);
    pSopCover = Mem_FlexEntryFetch( pMan, Length + 1 );
    memset( pSopCover, '-', (size_t)Length );
    pSopCover[Length] = 0;

    for ( i = 0; i < nCubes; i++ )
    {
        pCube = pSopCover + i * (nVars + 3);
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    return pSopCover;
}